

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::InsertCompileDefinition(cmTarget *this,cmValueWithOrigin *entry)

{
  cmTargetInternals *pcVar1;
  TargetPropertyEntry *this_00;
  cmGeneratorExpression local_50;
  cmCompiledGeneratorExpression *local_48;
  auto_ptr<cmCompiledGeneratorExpression> local_40;
  TargetPropertyEntry *local_38 [3];
  undefined1 local_20 [8];
  cmGeneratorExpression ge;
  cmValueWithOrigin *entry_local;
  cmTarget *this_local;
  
  ge.Backtrace = (cmListFileBacktrace *)entry;
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_20,&entry->Backtrace);
  pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
  this_00 = (TargetPropertyEntry *)operator_new(0x10);
  cmGeneratorExpression::Parse(&local_50,(string *)local_20);
  local_48 = (cmCompiledGeneratorExpression *)
             cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_50);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_40,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_48);
  cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
            (this_00,&local_40,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
  local_38[0] = this_00;
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::push_back(&pcVar1->CompileDefinitionsEntries,local_38);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_40);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_50);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_20);
  return;
}

Assistant:

void cmTarget::InsertCompileDefinition(const cmValueWithOrigin &entry)
{
  cmGeneratorExpression ge(&entry.Backtrace);

  this->Internal->CompileDefinitionsEntries.push_back(
      new cmTargetInternals::TargetPropertyEntry(ge.Parse(entry.Value)));
}